

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t
XXH3_hashLong_128b_withSeed_internal
          (void *input,size_t len,XXH64_hash_t seed64,XXH3_f_accumulate f_acc,
          XXH3_f_scrambleAcc f_scramble,XXH3_f_initCustomSecret f_initSec)

{
  long in_RDX;
  code *in_R9;
  xxh_u8 secret [192];
  undefined1 auStackY_108 [80];
  XXH3_f_scrambleAcc in_stack_ffffffffffffff48;
  XXH3_f_accumulate in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  xxh_u8 *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  XXH128_hash_t local_10;
  
  if (in_RDX == 0) {
    local_10 = XXH3_hashLong_128b_internal
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    (*in_R9)(auStackY_108,in_RDX);
    local_10 = XXH3_hashLong_128b_internal
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return local_10;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH3_hashLong_128b_withSeed_internal(const void* XXH_RESTRICT input, size_t len,
                                XXH64_hash_t seed64,
                                XXH3_f_accumulate f_acc,
                                XXH3_f_scrambleAcc f_scramble,
                                XXH3_f_initCustomSecret f_initSec)
{
    if (seed64 == 0)
        return XXH3_hashLong_128b_internal(input, len,
                                           XXH3_kSecret, sizeof(XXH3_kSecret),
                                           f_acc, f_scramble);
    {   XXH_ALIGN(XXH_SEC_ALIGN) xxh_u8 secret[XXH_SECRET_DEFAULT_SIZE];
        f_initSec(secret, seed64);
        return XXH3_hashLong_128b_internal(input, len, (const xxh_u8*)secret, sizeof(secret),
                                           f_acc, f_scramble);
    }
}